

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::Normalize
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  size_type sVar1;
  char *message;
  const_reference pvVar2;
  reference pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined4 in_stack_00000008;
  uint16_t i_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  double correction;
  uint16_t i;
  uint16_t maximum;
  uint16_t minimum;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  undefined4 in_stack_fffffffffffffe14;
  uint32_t in_stack_fffffffffffffe18;
  uint32_t in_stack_fffffffffffffe1c;
  FunctionTask *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  value_type in_stack_fffffffffffffe2f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  Image *in_stack_fffffffffffffe38;
  FunctionTask *in_stack_fffffffffffffe40;
  uint32_t in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe68;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  Image *in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  Image *in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  ushort local_7c;
  undefined1 local_79;
  undefined1 local_78 [112];
  
  Histogram((Image *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
            (uint32_t)((ulong)in_stack_fffffffffffffe20 >> 0x20),(uint32_t)in_stack_fffffffffffffe20
            ,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_78 + 0x38));
  if (sVar1 == 0x100) {
    local_78._42_2_ = 0xff;
    local_78._40_2_ = 0;
    for (local_78._38_2_ = 0; (ushort)local_78._38_2_ < 0x100; local_78._38_2_ = local_78._38_2_ + 1
        ) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_78 + 0x38),
                          (ulong)(ushort)local_78._38_2_);
      if (*pvVar2 != 0) {
        if ((ushort)local_78._40_2_ < (ushort)local_78._38_2_) {
          local_78._40_2_ = local_78._38_2_;
        }
        if ((ushort)local_78._38_2_ < (ushort)local_78._42_2_) {
          local_78._42_2_ = local_78._38_2_;
        }
      }
    }
    if ((ushort)local_78._42_2_ < (ushort)local_78._40_2_) {
      local_78._24_8_ =
           255.0 / (double)(int)((uint)(ushort)local_78._40_2_ - (uint)(ushort)local_78._42_2_);
      auVar5 = ZEXT864((ulong)local_78._24_8_);
      this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_79;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1443ef);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (this,CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (allocator_type *)in_stack_fffffffffffffe20);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x144415);
      for (local_7c = 0; local_7c < 0x100; local_7c = local_7c + 1) {
        auVar6._0_8_ = (double)(int)((uint)local_7c - (uint)(ushort)local_78._42_2_);
        auVar6._8_8_ = auVar5._8_8_;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_78._24_8_;
        auVar4 = vfmadd213sd_fma(auVar4,auVar6,ZEXT816(0x3fe0000000000000));
        auVar5 = ZEXT1664(auVar4);
        in_stack_fffffffffffffe2f = (value_type)(int)auVar4._0_8_;
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
                            (ulong)local_7c);
        *pvVar3 = in_stack_fffffffffffffe2f;
      }
      FunctionTask::FunctionTask(in_stack_fffffffffffffe20);
      in_stack_fffffffffffffe20 = (FunctionTask *)local_78;
      FunctionTask::LookupTable
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(uint32_t)((ulong)this >> 0x20)
                 ,(uint32_t)this,
                 (Image *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                 (uint32_t)((ulong)in_stack_fffffffffffffe20 >> 0x20),in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
      FunctionTask::~FunctionTask
                ((FunctionTask *)CONCAT44(in_stack_fffffffffffffe14,in_stack_00000008));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe20)
      ;
    }
    else {
      penguinV::Copy(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe20);
    return;
  }
  message = (char *)__cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)in_stack_fffffffffffffe40,message);
  __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Normalize( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        const std::vector<uint32_t> histogram = Histogram( in, startXIn, startYIn, width, height );
        if ( histogram.size() != 256u )
            throw imageException( "Histogram size is not equal to 256" );

        uint16_t minimum = 255u;
        uint16_t maximum = 0u;

        for ( uint16_t i = 0u; i < 256u; ++i ) {
            if ( histogram[i] > 0u ) {
                if ( maximum < i )
                    maximum = i;
                if ( minimum > i )
                    minimum = i;
            }
        }

        if ( minimum >= maximum ) {
            penguinV::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const double correction = 255.0 / (maximum - minimum);

            // We precalculate all values and store them in lookup table
            std::vector < uint8_t > value( 256 );

            for( uint16_t i = 0; i < 256; ++i )
                value[i] = static_cast <uint8_t>((i - minimum) * correction + 0.5);

            FunctionTask().LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
        }
    }